

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Film::readFrom(Film *this,BinaryReader *binary)

{
  pointer __buf;
  vec2i __nbytes;
  runtime_error *this_00;
  
  __buf = (binary->currentEntityData).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (binary->currentEntityOffset + 8 <=
      (ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__buf)) {
    __nbytes = *(vec2i *)(__buf + binary->currentEntityOffset);
    this->resolution = __nbytes;
    binary->currentEntityOffset = binary->currentEntityOffset + 8;
    BinaryReader::read(binary,(int)this + 0x20,__buf,(size_t)__nbytes);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"invalid read attempt by entity - not enough data in data block!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Film::readFrom(BinaryReader &binary) 
  {
    binary.read(resolution);
    binary.read(fileName);
  }